

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid3D.cpp
# Opt level: O2

void __thiscall
TPZGenGrid3D::TPZGenGrid3D
          (TPZGenGrid3D *this,TPZVec<double> *minX,TPZVec<double> *maxX,TPZVec<int> *nelDiv,
          MMeshType meshType)

{
  int *piVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  ostream *poVar5;
  size_t sStack_30;
  
  this->fGmesh = (TPZGeoMesh *)0x0;
  this->fMeshType = meshType;
  TPZManVector<int,_3>::TPZManVector(&this->fNelDiv,nelDiv);
  TPZManVector<double,_3>::TPZManVector(&this->fMinX,minX);
  TPZManVector<double,_3>::TPZManVector(&this->fMaxX,maxX);
  if ((((this->fMinX).super_TPZVec<double>.fNElements != 3) ||
      ((this->fMaxX).super_TPZVec<double>.fNElements != 3)) ||
     ((this->fNelDiv).super_TPZVec<int>.fNElements != 3)) {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                            );
    std::operator<<(poVar5," error\n");
    std::operator<<((ostream *)&std::cerr,"minX, maxX and nelDiv must have size = 3!\n");
    poVar5 = std::operator<<((ostream *)&std::cerr,"size(minX) = ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"size(maxX) = ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"size(nelDiv) = ");
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::operator<<(poVar5,"\n");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid3D.cpp"
               ,0x18);
  }
  iVar4 = MMeshType_Dimension(this->fMeshType);
  if (iVar4 == 3) {
    piVar1 = (this->fNelDiv).super_TPZVec<int>.fStore;
    if (((*piVar1 < 1) || (piVar1[1] < 1)) || (piVar1[2] < 1)) {
      poVar5 = std::operator<<((ostream *)&std::cerr,
                               "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                              );
      std::operator<<(poVar5," error\n");
      std::operator<<((ostream *)&std::cerr,
                      "The read number of grid divisions is not allowed. The parameters are:\n");
      poVar5 = std::operator<<((ostream *)&std::cerr,"nel x: ");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*(this->fNelDiv).super_TPZVec<int>.fStore)
      ;
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"nel y: ");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,(this->fNelDiv).super_TPZVec<int>.fStore[1]);
      poVar5 = std::operator<<(poVar5,"\n");
      poVar5 = std::operator<<(poVar5,"nel z: ");
      poVar5 = (ostream *)
               std::ostream::operator<<(poVar5,(this->fNelDiv).super_TPZVec<int>.fStore[2]);
      std::operator<<(poVar5,"\n");
      sStack_30 = 0x23;
    }
    else {
      pdVar2 = (this->fMaxX).super_TPZVec<double>.fStore;
      if (((*pdVar2 < 1e-12) || (pdVar2[1] < 1e-12)) || (pdVar2[2] < 1e-12)) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                                );
        std::operator<<(poVar5," error\n");
        std::operator<<((ostream *)&std::cerr,
                        "Dimensions of grid not allowed. The parameters are:\n");
        std::operator<<((ostream *)&std::cerr,"max x: ");
        poVar5 = std::ostream::_M_insert<double>(*(this->fMaxX).super_TPZVec<double>.fStore);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,"max y: ");
        poVar5 = std::ostream::_M_insert<double>((this->fMaxX).super_TPZVec<double>.fStore[1]);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,"max z: ");
        poVar5 = std::ostream::_M_insert<double>((this->fMaxX).super_TPZVec<double>.fStore[2]);
        std::operator<<(poVar5,"\n");
        sStack_30 = 0x28;
      }
      else {
        pdVar3 = (this->fMinX).super_TPZVec<double>.fStore;
        if (((*pdVar3 <= *pdVar2) && (pdVar3[1] <= pdVar2[1])) && (pdVar3[2] <= pdVar2[2])) {
          return;
        }
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                                );
        std::operator<<(poVar5," error\n");
        std::operator<<((ostream *)&std::cerr,
                        "Dimensions of grid not allowed. The parameters are:\n");
        std::operator<<((ostream *)&std::cerr,"min x: ");
        poVar5 = std::ostream::_M_insert<double>(*(this->fMinX).super_TPZVec<double>.fStore);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,"min y: ");
        poVar5 = std::ostream::_M_insert<double>((this->fMinX).super_TPZVec<double>.fStore[1]);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,"min z: ");
        poVar5 = std::ostream::_M_insert<double>((this->fMinX).super_TPZVec<double>.fStore[2]);
        std::operator<<(poVar5,"\n");
        std::operator<<((ostream *)&std::cerr,"max x: ");
        poVar5 = std::ostream::_M_insert<double>(*(this->fMaxX).super_TPZVec<double>.fStore);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,"max y: ");
        poVar5 = std::ostream::_M_insert<double>((this->fMaxX).super_TPZVec<double>.fStore[1]);
        poVar5 = std::operator<<(poVar5,"\n");
        std::operator<<(poVar5,"max z: ");
        poVar5 = std::ostream::_M_insert<double>((this->fMaxX).super_TPZVec<double>.fStore[2]);
        std::operator<<(poVar5,"\n");
        sStack_30 = 0x2f;
      }
    }
  }
  else {
    poVar5 = std::operator<<((ostream *)&std::cerr,
                             "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                            );
    std::operator<<(poVar5," error\n");
    poVar5 = std::operator<<((ostream *)&std::cerr,"Element type ");
    poVar5 = ::operator<<(poVar5,this->fMeshType);
    std::operator<<(poVar5," is not supported. Aborting...\n");
    sStack_30 = 0x1d;
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid3D.cpp"
             ,sStack_30);
}

Assistant:

TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &minX, const TPZVec<REAL> &maxX, const TPZVec<int> &nelDiv, const MMeshType meshType)
                           :fGmesh{nullptr}, fMinX{minX}, fMaxX{maxX},fNelDiv{nelDiv},fMeshType{meshType}{
    const REAL tol{ZeroTolerance()};
    if(fMinX.NElements() != 3 || fMaxX.NElements() != 3 || fNelDiv.NElements() != 3){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"minX, maxX and nelDiv must have size = 3!\n";
        PZError<<"size(minX) = "<<fMinX.NElements()<<"\n"
               <<"size(maxX) = "<<fMaxX.NElements()<<"\n"
               <<"size(nelDiv) = "<<fNelDiv.NElements()<<"\n";
        DebugStop();
    }
    if(MMeshType_Dimension(fMeshType) != fDim){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Element type "<<fMeshType<<" is not supported. Aborting...\n";
        DebugStop();
    }
    else if(fNelDiv[0] < 1 || fNelDiv[1] < 1 || fNelDiv[2] < 1){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"The read number of grid divisions is not allowed. The parameters are:\n";
        PZError<<"nel x: "<<fNelDiv[0]<<"\n"<<"nel y: "<<fNelDiv[1]<<"\n"<<"nel z: "<<fNelDiv[2]<<"\n";
        DebugStop();
    }else if(fMaxX[0] < tol || fMaxX[1] < tol || fMaxX[2] < tol){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
    else if(fMaxX[0] < fMinX[0] || fMaxX[1] < fMinX[1] || fMaxX[2] < fMinX[2]){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"min x: "<<fMinX[0]<<"\n"<<"min y: "<<fMinX[1]<<"\n"<<"min z: "<<fMinX[2]<<"\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
}